

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O2

QByteArray * __thiscall QRestReply::readBody(QByteArray *__return_storage_ptr__,QRestReply *this)

{
  bool bVar1;
  
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)this);
  if (bVar1) {
    QIODevice::readAll();
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QRestReply::readBody()
{
    return wrapped ? wrapped->readAll() : QByteArray{};
}